

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O3

void __thiscall RingBuffer<QuickPacket>::RingBuffer(RingBuffer<QuickPacket> *this,uint16_t capacity)

{
  long lVar1;
  ulong *puVar2;
  undefined6 in_register_00000032;
  long lVar3;
  
  this->_capacity = (int)CONCAT62(in_register_00000032,capacity);
  this->_read_index = 0;
  this->_write_index = 0;
  this->_buffer = (QuickPacket *)0x0;
  if ((ushort)(capacity - 3) < 0xfffc) {
    puVar2 = (ulong *)operator_new__((ulong)capacity * 0x28 + 8);
    *puVar2 = (ulong)capacity;
    lVar3 = 8;
    do {
      QuickPacket::QuickPacket((QuickPacket *)((long)puVar2 + lVar3));
      lVar1 = lVar3 + 0x28;
      lVar3 = lVar3 + 0x28;
    } while (lVar1 + (ulong)capacity * -0x28 != 8);
    this->_buffer = (QuickPacket *)(puVar2 + 1);
    LOCK();
    (this->_packet_count).super___atomic_base<unsigned_short>._M_i = 0;
    UNLOCK();
    return;
  }
  __assert_fail("capacity > 2 && capacity < MAX_PACKET_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/ring_buffer.h"
                ,0xb,"RingBuffer<QuickPacket>::RingBuffer(uint16_t) [T = QuickPacket]");
}

Assistant:

explicit RingBuffer(uint16_t capacity) :
	_capacity(capacity){
		assert(capacity > 2 && capacity < MAX_PACKET_COUNT);
		_buffer = new T[_capacity];
		_packet_count = 0;
	}